

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O0

void oss_gets_delchar(osgen_txtwin_t *win,char *buf,char *p,char **eol,int x,int y)

{
  int top;
  ulong *in_RCX;
  void *in_RDX;
  osgen_win_t *in_RSI;
  osgen_txtwin_t *in_RDI;
  int in_R8D;
  int in_R9D;
  int unaff_retaddr;
  undefined4 unaff_retaddr_00;
  int color;
  undefined8 uVar1;
  int in_stack_ffffffffffffffd0;
  
  top = ossgetcolor(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                    (int)((ulong)in_RSI >> 0x20));
  if (in_RDX < (void *)*in_RCX) {
    *in_RCX = *in_RCX - 1;
    if (in_RDX != (void *)*in_RCX) {
      memmove(in_RDX,(void *)((long)in_RDX + 1),*in_RCX - (long)in_RDX);
    }
    *(undefined1 *)*in_RCX = 0;
    uVar1 = 0;
    ossdsp_str(in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX,(int)((ulong)in_RCX >> 0x20),
               (char *)CONCAT44(in_R8D,in_R9D),CONCAT44(top,in_stack_ffffffffffffffd0),
               (int *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
    oss_gets_csrright(in_RDI,(int *)&stack0xffffffffffffffd8,(int *)&stack0xffffffffffffffdc,
                      *in_RCX - (long)in_RDX);
    ossclr(top,in_stack_ffffffffffffffd0,(int)((ulong)uVar1 >> 0x20),(int)uVar1,0);
  }
  return;
}

Assistant:

static void oss_gets_delchar(osgen_txtwin_t *win,
                             char *buf, char *p, char **eol, int x, int y)
{
    int color;
    
    /* get the oss color for the current text in the window */
    color = ossgetcolor(win->base.txtfg, win->base.txtbg,
                        win->base.txtattr, win->base.fillcolor);

    /* if the character is within the buffer, delete it */
    if (p < *eol)
    {
        /* delete the character and close the gap */
        --*eol;
        if (p != *eol)
            memmove(p, p + 1, *eol - p);

        /* null-terminate the shortened buffer */
        **eol = '\0';
        
        /* re-display the changed part of the string */
        ossdsp_str(&win->base, y, x, color, p, *eol - p, 0);

        /* move to the position of the former last character */
        oss_gets_csrright(win, &y, &x, *eol - p);

        /* clear the screen area where the old last character was displayed */
        ossclr(y, x, y, x, win->base.oss_fillcolor);
    }
}